

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  bool bVar1;
  char *pcVar2;
  cmMessenger *messenger;
  size_type sVar3;
  pointer pcVar4;
  reference ppcVar5;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_580;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_578;
  iterator sdi;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_550;
  const_iterator local_548;
  allocator local_539;
  string local_538;
  undefined1 local_518 [8];
  cmListFileArgument prj;
  cmListFileFunction project;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_488;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_480;
  iterator i_2;
  iterator iStack_470;
  bool hasProject;
  _Self local_468;
  undefined1 local_460 [8];
  string name;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_438;
  iterator i_1;
  allocator local_419;
  value_type local_418;
  _Base_ptr local_3f8;
  undefined1 local_3f0;
  allocator local_3e1;
  value_type local_3e0;
  _Base_ptr local_3c0;
  undefined1 local_3b8;
  allocator local_3a9;
  value_type local_3a8;
  _Base_ptr local_388;
  undefined1 local_380;
  allocator local_371;
  value_type local_370;
  _Base_ptr local_350;
  undefined1 local_348;
  allocator local_339;
  value_type local_338;
  _Base_ptr local_318;
  undefined1 local_310;
  allocator local_301;
  value_type local_300;
  _Base_ptr local_2e0;
  undefined1 local_2d8;
  allocator local_2c9;
  value_type local_2c8;
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  allocator local_291;
  value_type local_290;
  _Base_ptr local_270;
  undefined1 local_268;
  allocator local_259;
  value_type local_258;
  _Base_ptr local_238;
  undefined1 local_230;
  allocator local_221;
  value_type local_220;
  _Base_ptr local_200;
  undefined1 local_1f8;
  allocator local_1e9;
  value_type local_1e8;
  undefined1 local_1c8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowedCommands;
  undefined1 local_190 [7];
  bool isProblem;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_170;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_168;
  iterator i;
  undefined1 local_158 [3];
  bool hasVersion;
  cmListFile listFile;
  string local_138;
  allocator local_111;
  cmStateDirectory local_110;
  string local_e8 [8];
  string filesDir;
  BuildsystemFileScope scope;
  allocator local_59;
  cmStateDirectory local_58;
  undefined1 local_30 [8];
  string currentStart;
  cmMakefile *this_local;
  
  currentStart.field_2._8_8_ = this;
  cmStateSnapshot::GetDirectory(&local_58,&this->StateSnapshot);
  pcVar2 = cmStateDirectory::GetCurrentSource(&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,pcVar2,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::__cxx11::string::operator+=((string *)local_30,"/CMakeLists.txt");
  cmListFileBacktrace::Push
            ((cmListFileBacktrace *)&scope.ReportError,&this->Backtrace,(string *)local_30);
  cmListFileBacktrace::operator=(&this->Backtrace,(cmListFileBacktrace *)&scope.ReportError);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&scope.ReportError);
  BuildsystemFileScope::BuildsystemFileScope
            ((BuildsystemFileScope *)((long)&filesDir.field_2 + 8),this);
  cmStateSnapshot::GetDirectory(&local_110,&this->StateSnapshot);
  pcVar2 = cmStateDirectory::GetCurrentBinary(&local_110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,pcVar2,&local_111);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  pcVar2 = cmake::GetCMakeFilesDirectory();
  std::__cxx11::string::operator+=(local_e8,pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cmsys::SystemTools::MakeDirectory(pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar2,true);
  if (!bVar1) {
    __assert_fail("cmSystemTools::FileExists(currentStart.c_str(), true)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmMakefile.cxx"
                  ,0x57a,"void cmMakefile::Configure()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_138,"CMAKE_PARENT_LIST_FILE",
             (allocator *)
             ((long)&listFile.Functions.
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  AddDefinition(this,&local_138,pcVar2);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&listFile.Functions.
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cmListFile::cmListFile((cmListFile *)local_158);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  messenger = GetMessenger(this);
  bVar1 = cmListFile::ParseFile((cmListFile *)local_158,pcVar2,messenger,&this->Backtrace);
  if (bVar1) {
    bVar1 = IsRootMakefile(this);
    if (bVar1) {
      i._M_current._3_1_ = 0;
      local_168._M_current =
           (cmListFileFunction *)
           std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                     ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_158);
      while( true ) {
        local_170._M_current =
             (cmListFileFunction *)
             std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                       ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_158
                       );
        bVar1 = __gnu_cxx::operator!=(&local_168,&local_170);
        if (!bVar1) break;
        pcVar4 = __gnu_cxx::
                 __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                 ::operator->(&local_168);
        cmsys::SystemTools::LowerCase((string *)local_190,(string *)pcVar4);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_190,"cmake_minimum_required");
        std::__cxx11::string::~string((string *)local_190);
        if (bVar1) {
          i._M_current._3_1_ = 1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
        ::operator++(&local_168);
      }
      if ((i._M_current._3_1_ & 1) == 0) {
        allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
        sVar3 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::size
                          ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                           local_158);
        if (sVar3 < 0x1e) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1c8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1e8,"project",&local_1e9);
          pVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1c8,&local_1e8);
          local_200 = (_Base_ptr)pVar6.first._M_node;
          local_1f8 = pVar6.second;
          std::__cxx11::string::~string((string *)&local_1e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_220,"set",&local_221);
          pVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1c8,&local_220);
          local_238 = (_Base_ptr)pVar6.first._M_node;
          local_230 = pVar6.second;
          std::__cxx11::string::~string((string *)&local_220);
          std::allocator<char>::~allocator((allocator<char> *)&local_221);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_258,"if",&local_259);
          pVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1c8,&local_258);
          local_270 = (_Base_ptr)pVar6.first._M_node;
          local_268 = pVar6.second;
          std::__cxx11::string::~string((string *)&local_258);
          std::allocator<char>::~allocator((allocator<char> *)&local_259);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_290,"endif",&local_291);
          pVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1c8,&local_290);
          local_2a8 = (_Base_ptr)pVar6.first._M_node;
          local_2a0 = pVar6.second;
          std::__cxx11::string::~string((string *)&local_290);
          std::allocator<char>::~allocator((allocator<char> *)&local_291);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_2c8,"else",&local_2c9);
          pVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1c8,&local_2c8);
          local_2e0 = (_Base_ptr)pVar6.first._M_node;
          local_2d8 = pVar6.second;
          std::__cxx11::string::~string((string *)&local_2c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_300,"elseif",&local_301);
          pVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1c8,&local_300);
          local_318 = (_Base_ptr)pVar6.first._M_node;
          local_310 = pVar6.second;
          std::__cxx11::string::~string((string *)&local_300);
          std::allocator<char>::~allocator((allocator<char> *)&local_301);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_338,"add_executable",&local_339);
          pVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1c8,&local_338);
          local_350 = (_Base_ptr)pVar6.first._M_node;
          local_348 = pVar6.second;
          std::__cxx11::string::~string((string *)&local_338);
          std::allocator<char>::~allocator((allocator<char> *)&local_339);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_370,"add_library",&local_371);
          pVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1c8,&local_370);
          local_388 = (_Base_ptr)pVar6.first._M_node;
          local_380 = pVar6.second;
          std::__cxx11::string::~string((string *)&local_370);
          std::allocator<char>::~allocator((allocator<char> *)&local_371);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_3a8,"target_link_libraries",&local_3a9);
          pVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1c8,&local_3a8);
          local_3c0 = (_Base_ptr)pVar6.first._M_node;
          local_3b8 = pVar6.second;
          std::__cxx11::string::~string((string *)&local_3a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_3e0,"option",&local_3e1);
          pVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1c8,&local_3e0);
          local_3f8 = (_Base_ptr)pVar6.first._M_node;
          local_3f0 = pVar6.second;
          std::__cxx11::string::~string((string *)&local_3e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_418,"message",&local_419);
          pVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1c8,&local_418);
          i_1._M_current = (cmListFileFunction *)pVar6.first._M_node;
          std::__cxx11::string::~string((string *)&local_418);
          std::allocator<char>::~allocator((allocator<char> *)&local_419);
          allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
          local_438._M_current =
               (cmListFileFunction *)
               std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                         ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                          local_158);
          while( true ) {
            name.field_2._8_8_ =
                 std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                           ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                            local_158);
            bVar1 = __gnu_cxx::operator!=
                              (&local_438,
                               (__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                *)((long)&name.field_2 + 8));
            if (!bVar1) break;
            pcVar4 = __gnu_cxx::
                     __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                     ::operator->(&local_438);
            cmsys::SystemTools::LowerCase((string *)local_460,(string *)pcVar4);
            local_468._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1c8,(key_type *)local_460);
            iStack_470 = std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_1c8);
            bVar1 = std::operator==(&local_468,&stack0xfffffffffffffb90);
            if (bVar1) {
              allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
              i._M_current._4_4_ = 5;
            }
            else {
              i._M_current._4_4_ = 0;
            }
            std::__cxx11::string::~string((string *)local_460);
            if (i._M_current._4_4_ != 0) break;
            __gnu_cxx::
            __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
            ::operator++(&local_438);
          }
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1c8);
        }
        if ((allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
          SetCheckCMP0000(this,true);
          SetPolicyVersion(this,"2.4");
        }
      }
      i_2._M_current._7_1_ = 0;
      local_480._M_current =
           (cmListFileFunction *)
           std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                     ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_158);
      while( true ) {
        local_488._M_current =
             (cmListFileFunction *)
             std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                       ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_158
                       );
        bVar1 = __gnu_cxx::operator!=(&local_480,&local_488);
        if (!bVar1) break;
        pcVar4 = __gnu_cxx::
                 __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                 ::operator->(&local_480);
        cmsys::SystemTools::LowerCase
                  ((string *)
                   &project.Arguments.
                    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pcVar4);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&project.Arguments.
                                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"project");
        std::__cxx11::string::~string
                  ((string *)
                   &project.Arguments.
                    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar1) {
          i_2._M_current._7_1_ = 1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
        ::operator++(&local_480);
      }
      if ((i_2._M_current._7_1_ & 1) == 0) {
        cmListFileFunction::cmListFileFunction((cmListFileFunction *)&prj.Line);
        std::__cxx11::string::operator=((string *)&prj.Line,"PROJECT");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_538,"Project",&local_539);
        cmListFileArgument::cmListFileArgument
                  ((cmListFileArgument *)local_518,&local_538,Unquoted,0);
        std::__cxx11::string::~string((string *)&local_538);
        std::allocator<char>::~allocator((allocator<char> *)&local_539);
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
                  ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                   &project.super_cmCommandContext.Line,(value_type *)local_518);
        local_550._M_current =
             (cmListFileFunction *)
             std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                       ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_158
                       );
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_const*,std::vector<cmListFileFunction,std::allocator<cmListFileFunction>>>
        ::__normal_iterator<cmListFileFunction*>
                  ((__normal_iterator<cmListFileFunction_const*,std::vector<cmListFileFunction,std::allocator<cmListFileFunction>>>
                    *)&local_548,&local_550);
        std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
                  ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_158,
                   local_548,(value_type *)&prj.Line);
        cmListFileArgument::~cmListFileArgument((cmListFileArgument *)local_518);
        cmListFileFunction::~cmListFileFunction((cmListFileFunction *)&prj.Line);
      }
    }
    ReadListFile(this,(cmListFile *)local_158,(string *)local_30);
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if (bVar1) {
      BuildsystemFileScope::Quiet((BuildsystemFileScope *)((long)&filesDir.field_2 + 8));
    }
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
              ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi,
               &this->UnConfiguredDirectories);
    local_578._M_current =
         (cmMakefile **)
         std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::begin
                   ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
    while( true ) {
      local_580._M_current =
           (cmMakefile **)
           std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::end
                     ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
      bVar1 = __gnu_cxx::operator!=(&local_578,&local_580);
      if (!bVar1) break;
      ppcVar5 = __gnu_cxx::
                __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                ::operator*(&local_578);
      cmStateSnapshot::InitializeFromParent_ForSubdirsCommand(&(*ppcVar5)->StateSnapshot);
      ppcVar5 = __gnu_cxx::
                __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                ::operator*(&local_578);
      ConfigureSubDirectory(this,*ppcVar5);
      __gnu_cxx::
      __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>::
      operator++(&local_578);
    }
    AddCMakeDependFilesFromUser(this);
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~vector
              ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
    i._M_current._4_4_ = 0;
  }
  else {
    i._M_current._4_4_ = 1;
  }
  cmListFile::~cmListFile((cmListFile *)local_158);
  std::__cxx11::string::~string(local_e8);
  BuildsystemFileScope::~BuildsystemFileScope((BuildsystemFileScope *)((long)&filesDir.field_2 + 8))
  ;
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmMakefile::Configure()
{
  std::string currentStart =
    this->StateSnapshot.GetDirectory().GetCurrentSource();
  currentStart += "/CMakeLists.txt";

  // Add the bottom of all backtraces within this directory.
  // We will never pop this scope because it should be available
  // for messages during the generate step too.
  this->Backtrace = this->Backtrace.Push(currentStart);

  BuildsystemFileScope scope(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  filesDir += cmake::GetCMakeFilesDirectory();
  cmSystemTools::MakeDirectory(filesDir.c_str());

  assert(cmSystemTools::FileExists(currentStart.c_str(), true));
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentStart.c_str());

  cmListFile listFile;
  if (!listFile.ParseFile(currentStart.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return;
  }
  if (this->IsRootMakefile()) {
    bool hasVersion = false;
    // search for the right policy command
    for (std::vector<cmListFileFunction>::iterator i =
           listFile.Functions.begin();
         i != listFile.Functions.end(); ++i) {
      if (cmSystemTools::LowerCase(i->Name) == "cmake_minimum_required") {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if (!hasVersion) {
      bool isProblem = true;
      if (listFile.Functions.size() < 30) {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for (std::vector<cmListFileFunction>::iterator i =
               listFile.Functions.begin();
             i != listFile.Functions.end(); ++i) {
          std::string name = cmSystemTools::LowerCase(i->Name);
          if (allowedCommands.find(name) == allowedCommands.end()) {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem) {
        // Tell the top level cmMakefile to diagnose
        // this violation of CMP0000.
        this->SetCheckCMP0000(true);

        // Implicitly set the version for the user.
        this->SetPolicyVersion("2.4");
      }
    }
    bool hasProject = false;
    // search for a project command
    for (std::vector<cmListFileFunction>::iterator i =
           listFile.Functions.begin();
         i != listFile.Functions.end(); ++i) {
      if (cmSystemTools::LowerCase(i->Name) == "project") {
        hasProject = true;
        break;
      }
    }
    // if no project command is found, add one
    if (!hasProject) {
      cmListFileFunction project;
      project.Name = "PROJECT";
      cmListFileArgument prj("Project", cmListFileArgument::Unquoted, 0);
      project.Arguments.push_back(prj);
      listFile.Functions.insert(listFile.Functions.begin(), project);
    }
  }

  this->ReadListFile(listFile, currentStart);
  if (cmSystemTools::GetFatalErrorOccured()) {
    scope.Quiet();
  }

  // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  std::vector<cmMakefile*>::iterator sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi) {
    (*sdi)->StateSnapshot.InitializeFromParent_ForSubdirsCommand();
    this->ConfigureSubDirectory(*sdi);
  }

  this->AddCMakeDependFilesFromUser();
}